

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O0

PyObject * libxml_xmlRemoveRef(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *local_60;
  PyObject *local_58;
  undefined *local_50;
  PyObject *pyobj_attr;
  xmlAttrPtr attr;
  PyObject *pyobj_doc;
  xmlDocPtr doc;
  int c_retval;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = libxml_deprecationWarning("xmlRemoveRef");
  if (iVar1 == -1) {
    self_local = (PyObject *)0x0;
  }
  else {
    iVar1 = _PyArg_ParseTuple_SizeT(py_retval,"OO:xmlRemoveRef",&attr,&local_50);
    if (iVar1 == 0) {
      self_local = (PyObject *)0x0;
    }
    else {
      if (attr == (xmlAttrPtr)&_Py_NoneStruct) {
        local_58 = (PyObject *)0x0;
      }
      else {
        local_58 = (PyObject *)attr->name;
      }
      pyobj_doc = local_58;
      if (local_50 == &_Py_NoneStruct) {
        local_60 = (PyObject *)0x0;
      }
      else {
        local_60 = *(PyObject **)(local_50 + 0x10);
      }
      pyobj_attr = local_60;
      doc._4_4_ = xmlRemoveRef(local_58,local_60);
      self_local = libxml_intWrap(doc._4_4_);
    }
  }
  return self_local;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlRemoveRef(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    int c_retval;
    xmlDocPtr doc;
    PyObject *pyobj_doc;
    xmlAttrPtr attr;
    PyObject *pyobj_attr;

    if (libxml_deprecationWarning("xmlRemoveRef") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"OO:xmlRemoveRef", &pyobj_doc, &pyobj_attr))
        return(NULL);
    doc = (xmlDocPtr) PyxmlNode_Get(pyobj_doc);
    attr = (xmlAttrPtr) PyxmlNode_Get(pyobj_attr);

    c_retval = xmlRemoveRef(doc, attr);
    py_retval = libxml_intWrap((int) c_retval);
    return(py_retval);
}